

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_value.cpp
# Opt level: O1

void duckdb::ListValueFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  undefined8 *puVar2;
  PhysicalType PVar3;
  data_ptr_t pdVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  long lVar8;
  byte bVar9;
  undefined8 uVar10;
  buffer_ptr<VectorBuffer> *pbVar11;
  DataChunk *pDVar12;
  undefined1 auVar13 [8];
  element_type *peVar14;
  reference pvVar15;
  Vector *pVVar16;
  TemplatedValidityData<unsigned_long> *pTVar17;
  Vector *pVVar18;
  reference pvVar19;
  LogicalType *target_type;
  idx_t iVar20;
  ulong uVar21;
  idx_t idx_in_entry;
  size_type sVar22;
  ulong uVar23;
  size_type __n;
  undefined1 *puVar24;
  pointer pVVar25;
  VectorType *pVVar26;
  pointer pVVar27;
  idx_t idx_in_entry_1;
  pointer pVVar28;
  long lVar29;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var30;
  idx_t iVar31;
  bool bVar32;
  string_t sVar33;
  unsafe_unique_array<UnifiedVectorFormat> unified_format;
  idx_t offset_sum;
  value_type list;
  vector<unsigned_long,_true> col_offsets;
  DataChunk local_168;
  DataChunk *local_128;
  Vector *local_120;
  pointer local_118;
  pointer local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  element_type *apeStack_f0 [6];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  Value local_88;
  long local_40;
  data_ptr_t local_38;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pdVar4 = result->data;
    pdVar4[0] = '\0';
    pdVar4[1] = '\0';
    pdVar4[2] = '\0';
    pdVar4[3] = '\0';
    pdVar4[4] = '\0';
    pdVar4[5] = '\0';
    pdVar4[6] = '\0';
    pdVar4[7] = '\0';
    pdVar4[8] = '\0';
    pdVar4[9] = '\0';
    pdVar4[10] = '\0';
    pdVar4[0xb] = '\0';
    pdVar4[0xc] = '\0';
    pdVar4[0xd] = '\0';
    pdVar4[0xe] = '\0';
    pdVar4[0xf] = '\0';
    return;
  }
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar22 = 0;
    do {
      pvVar15 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar22);
      if (pvVar15->vector_type != CONSTANT_VECTOR) {
        Vector::SetVectorType(result,FLAT_VECTOR);
      }
      sVar22 = sVar22 + 1;
    } while (sVar22 < (ulong)(((long)(args->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(args->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5));
  }
  pVVar16 = ListVector::GetEntry(result);
  PVar3 = (pVVar16->type).physical_type_;
  local_128 = args;
  local_120 = result;
  if (PVar3 < VARCHAR) {
    switch(PVar3) {
    case BOOL:
    case INT8:
      local_168.count =
           (idx_t)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(((long)((long)local_168.vector_caches.
                                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   .
                                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            local_168.count) >> 3) * 0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count *
                                 (long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)result->data;
      pVVar16 = ListVector::GetEntry(result);
      pdVar4 = pVVar16->data;
      FlatVector::VerifyFlatVector(pVVar16);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar21 = args->count;
      if (uVar21 != 0) {
        local_168.capacity =
             (idx_t)&(pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(&(local_168.data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish)->vector_type +
                      (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish == (pointer)0x0));
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar23 = 0;
        do {
          if (local_168.vector_caches.
              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
              super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)local_168.count) {
            lVar29 = 0x10;
            pVVar27 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            pVVar26 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              lVar5 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar29 + -0x10);
              uVar21 = uVar23;
              if (lVar5 != 0) {
                uVar21 = (ulong)*(uint *)(lVar5 + uVar23 * 4);
              }
              lVar5 = *(long *)((long)&(local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                               lVar29);
              if ((lVar5 == 0) ||
                 ((*(ulong *)(lVar5 + (uVar21 >> 6) * 8) >> (uVar21 & 0x3f) & 1) != 0)) {
                pdVar4[(long)pVVar27] =
                     *(data_t *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar29 + -8) +
                      uVar21);
              }
              else {
                if ((pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar14 = apeStack_f0[0];
                  auVar13 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var6 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar13;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar14;
                  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                  }
                  if (apeStack_f0[0] != (element_type *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.capacity);
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar17->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar9 = (byte)pVVar27 & 0x3f;
                puVar1 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_mask + ((ulong)pVVar27 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              pVVar27 = (pointer)&pVVar27->field_0x1;
              lVar29 = lVar29 + 0x48;
              pVVar26 = pVVar26 + -1;
            } while (pVVar26 != (data_ptr_t)0x0);
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->buffer + uVar23 * 0x10) =
               uVar23 * (long)local_168.data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_finish + 8))->id_ + uVar23 * 0x10) =
               local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
          uVar23 = uVar23 + 1;
          uVar21 = local_128->count;
          local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(&(local_168.data.
                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->vector_type +
                        (long)&(local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)->vector_type);
        } while (uVar23 < uVar21);
      }
      ListVector::SetListSize
                (local_120,
                 uVar21 * (long)local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish);
      break;
    case UINT8:
      local_168.count =
           (idx_t)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(((long)((long)local_168.vector_caches.
                                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   .
                                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            local_168.count) >> 3) * 0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count *
                                 (long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)result->data;
      pVVar16 = ListVector::GetEntry(result);
      pdVar4 = pVVar16->data;
      FlatVector::VerifyFlatVector(pVVar16);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar21 = args->count;
      if (uVar21 != 0) {
        local_168.capacity =
             (idx_t)&(pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(&(local_168.data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish)->vector_type +
                      (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish == (pointer)0x0));
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar23 = 0;
        do {
          if (local_168.vector_caches.
              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
              super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)local_168.count) {
            lVar29 = 0x10;
            pVVar27 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            pVVar26 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              lVar5 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar29 + -0x10);
              uVar21 = uVar23;
              if (lVar5 != 0) {
                uVar21 = (ulong)*(uint *)(lVar5 + uVar23 * 4);
              }
              lVar5 = *(long *)((long)&(local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                               lVar29);
              if ((lVar5 == 0) ||
                 ((*(ulong *)(lVar5 + (uVar21 >> 6) * 8) >> (uVar21 & 0x3f) & 1) != 0)) {
                pdVar4[(long)pVVar27] =
                     *(data_t *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar29 + -8) +
                      uVar21);
              }
              else {
                if ((pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar14 = apeStack_f0[0];
                  auVar13 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var6 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar13;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar14;
                  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                  }
                  if (apeStack_f0[0] != (element_type *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.capacity);
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar17->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar9 = (byte)pVVar27 & 0x3f;
                puVar1 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_mask + ((ulong)pVVar27 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              pVVar27 = (pointer)&pVVar27->field_0x1;
              lVar29 = lVar29 + 0x48;
              pVVar26 = pVVar26 + -1;
            } while (pVVar26 != (data_ptr_t)0x0);
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->buffer + uVar23 * 0x10) =
               uVar23 * (long)local_168.data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_finish + 8))->id_ + uVar23 * 0x10) =
               local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
          uVar23 = uVar23 + 1;
          uVar21 = local_128->count;
          local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(&(local_168.data.
                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->vector_type +
                        (long)&(local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)->vector_type);
        } while (uVar23 < uVar21);
      }
      ListVector::SetListSize
                (local_120,
                 uVar21 * (long)local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish);
      break;
    case UINT16:
      local_168.count =
           (idx_t)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(((long)((long)local_168.vector_caches.
                                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   .
                                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            local_168.count) >> 3) * 0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count *
                                 (long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)result->data;
      pVVar16 = ListVector::GetEntry(result);
      pdVar4 = pVVar16->data;
      FlatVector::VerifyFlatVector(pVVar16);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar21 = args->count;
      if (uVar21 != 0) {
        local_168.capacity =
             (idx_t)&(pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(&(local_168.data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish)->vector_type +
                      (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish == (pointer)0x0));
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar23 = 0;
        do {
          if (local_168.vector_caches.
              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
              super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)local_168.count) {
            lVar29 = 8;
            pVVar27 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            pVVar26 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              lVar5 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar29 * 2 + -0x10);
              uVar21 = uVar23;
              if (lVar5 != 0) {
                uVar21 = (ulong)*(uint *)(lVar5 + uVar23 * 4);
              }
              lVar5 = *(long *)((long)&(local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                               lVar29 * 2);
              if ((lVar5 == 0) ||
                 ((*(ulong *)(lVar5 + (uVar21 >> 6) * 8) >> (uVar21 & 0x3f) & 1) != 0)) {
                *(undefined2 *)(pdVar4 + (long)pVVar27 * 2) =
                     *(undefined2 *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar29 * 2 + -8)
                      + uVar21 * 2);
              }
              else {
                if ((pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar14 = apeStack_f0[0];
                  auVar13 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var6 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar13;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar14;
                  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                  }
                  if (apeStack_f0[0] != (element_type *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.capacity);
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar17->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar9 = (byte)pVVar27 & 0x3f;
                puVar1 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_mask + ((ulong)pVVar27 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              pVVar27 = (pointer)&pVVar27->field_0x1;
              lVar29 = lVar29 + 0x24;
              pVVar26 = pVVar26 + -1;
            } while (pVVar26 != (data_ptr_t)0x0);
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->buffer + uVar23 * 0x10) =
               uVar23 * (long)local_168.data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_finish + 8))->id_ + uVar23 * 0x10) =
               local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
          uVar23 = uVar23 + 1;
          uVar21 = local_128->count;
          local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(&(local_168.data.
                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->vector_type +
                        (long)&(local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)->vector_type);
        } while (uVar23 < uVar21);
      }
      ListVector::SetListSize
                (local_120,
                 uVar21 * (long)local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish);
      break;
    case INT16:
      local_168.count =
           (idx_t)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(((long)((long)local_168.vector_caches.
                                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   .
                                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            local_168.count) >> 3) * 0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count *
                                 (long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)result->data;
      pVVar16 = ListVector::GetEntry(result);
      pdVar4 = pVVar16->data;
      FlatVector::VerifyFlatVector(pVVar16);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar21 = args->count;
      if (uVar21 != 0) {
        local_168.capacity =
             (idx_t)&(pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(&(local_168.data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish)->vector_type +
                      (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish == (pointer)0x0));
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar23 = 0;
        do {
          if (local_168.vector_caches.
              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
              super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)local_168.count) {
            lVar29 = 8;
            pVVar27 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            pVVar26 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              lVar5 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar29 * 2 + -0x10);
              uVar21 = uVar23;
              if (lVar5 != 0) {
                uVar21 = (ulong)*(uint *)(lVar5 + uVar23 * 4);
              }
              lVar5 = *(long *)((long)&(local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                               lVar29 * 2);
              if ((lVar5 == 0) ||
                 ((*(ulong *)(lVar5 + (uVar21 >> 6) * 8) >> (uVar21 & 0x3f) & 1) != 0)) {
                *(undefined2 *)(pdVar4 + (long)pVVar27 * 2) =
                     *(undefined2 *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar29 * 2 + -8)
                      + uVar21 * 2);
              }
              else {
                if ((pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar14 = apeStack_f0[0];
                  auVar13 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var6 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar13;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar14;
                  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                  }
                  if (apeStack_f0[0] != (element_type *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.capacity);
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar17->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar9 = (byte)pVVar27 & 0x3f;
                puVar1 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_mask + ((ulong)pVVar27 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              pVVar27 = (pointer)&pVVar27->field_0x1;
              lVar29 = lVar29 + 0x24;
              pVVar26 = pVVar26 + -1;
            } while (pVVar26 != (data_ptr_t)0x0);
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->buffer + uVar23 * 0x10) =
               uVar23 * (long)local_168.data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_finish + 8))->id_ + uVar23 * 0x10) =
               local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
          uVar23 = uVar23 + 1;
          uVar21 = local_128->count;
          local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(&(local_168.data.
                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->vector_type +
                        (long)&(local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)->vector_type);
        } while (uVar23 < uVar21);
      }
      ListVector::SetListSize
                (local_120,
                 uVar21 * (long)local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish);
      break;
    case UINT32:
      local_168.count =
           (idx_t)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(((long)((long)local_168.vector_caches.
                                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   .
                                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            local_168.count) >> 3) * 0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count *
                                 (long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)result->data;
      pVVar16 = ListVector::GetEntry(result);
      pdVar4 = pVVar16->data;
      FlatVector::VerifyFlatVector(pVVar16);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar21 = args->count;
      if (uVar21 != 0) {
        local_168.capacity =
             (idx_t)&(pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(&(local_168.data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish)->vector_type +
                      (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish == (pointer)0x0));
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar23 = 0;
        do {
          if (local_168.vector_caches.
              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
              super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)local_168.count) {
            lVar29 = 4;
            pVVar27 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            pVVar26 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              lVar5 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar29 * 4 + -0x10);
              uVar21 = uVar23;
              if (lVar5 != 0) {
                uVar21 = (ulong)*(uint *)(lVar5 + uVar23 * 4);
              }
              lVar5 = *(long *)((long)&(local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                               lVar29 * 4);
              if ((lVar5 == 0) ||
                 ((*(ulong *)(lVar5 + (uVar21 >> 6) * 8) >> (uVar21 & 0x3f) & 1) != 0)) {
                *(undefined4 *)(pdVar4 + (long)pVVar27 * 4) =
                     *(undefined4 *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar29 * 4 + -8)
                      + uVar21 * 4);
              }
              else {
                if ((pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar14 = apeStack_f0[0];
                  auVar13 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var6 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar13;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar14;
                  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                  }
                  if (apeStack_f0[0] != (element_type *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.capacity);
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar17->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar9 = (byte)pVVar27 & 0x3f;
                puVar1 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_mask + ((ulong)pVVar27 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              pVVar27 = (pointer)&pVVar27->field_0x1;
              lVar29 = lVar29 + 0x12;
              pVVar26 = pVVar26 + -1;
            } while (pVVar26 != (data_ptr_t)0x0);
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->buffer + uVar23 * 0x10) =
               uVar23 * (long)local_168.data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_finish + 8))->id_ + uVar23 * 0x10) =
               local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
          uVar23 = uVar23 + 1;
          uVar21 = local_128->count;
          local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(&(local_168.data.
                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->vector_type +
                        (long)&(local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)->vector_type);
        } while (uVar23 < uVar21);
      }
      ListVector::SetListSize
                (local_120,
                 uVar21 * (long)local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish);
      break;
    case INT32:
      local_168.count =
           (idx_t)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(((long)((long)local_168.vector_caches.
                                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   .
                                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            local_168.count) >> 3) * 0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count *
                                 (long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)result->data;
      pVVar16 = ListVector::GetEntry(result);
      pdVar4 = pVVar16->data;
      FlatVector::VerifyFlatVector(pVVar16);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar21 = args->count;
      if (uVar21 != 0) {
        local_168.capacity =
             (idx_t)&(pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(&(local_168.data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish)->vector_type +
                      (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish == (pointer)0x0));
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar23 = 0;
        do {
          if (local_168.vector_caches.
              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
              super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)local_168.count) {
            lVar29 = 4;
            pVVar27 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            pVVar26 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              lVar5 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar29 * 4 + -0x10);
              uVar21 = uVar23;
              if (lVar5 != 0) {
                uVar21 = (ulong)*(uint *)(lVar5 + uVar23 * 4);
              }
              lVar5 = *(long *)((long)&(local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                               lVar29 * 4);
              if ((lVar5 == 0) ||
                 ((*(ulong *)(lVar5 + (uVar21 >> 6) * 8) >> (uVar21 & 0x3f) & 1) != 0)) {
                *(undefined4 *)(pdVar4 + (long)pVVar27 * 4) =
                     *(undefined4 *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar29 * 4 + -8)
                      + uVar21 * 4);
              }
              else {
                if ((pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar14 = apeStack_f0[0];
                  auVar13 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var6 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar13;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar14;
                  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                  }
                  if (apeStack_f0[0] != (element_type *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.capacity);
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar17->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar9 = (byte)pVVar27 & 0x3f;
                puVar1 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_mask + ((ulong)pVVar27 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              pVVar27 = (pointer)&pVVar27->field_0x1;
              lVar29 = lVar29 + 0x12;
              pVVar26 = pVVar26 + -1;
            } while (pVVar26 != (data_ptr_t)0x0);
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->buffer + uVar23 * 0x10) =
               uVar23 * (long)local_168.data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_finish + 8))->id_ + uVar23 * 0x10) =
               local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
          uVar23 = uVar23 + 1;
          uVar21 = local_128->count;
          local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(&(local_168.data.
                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->vector_type +
                        (long)&(local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)->vector_type);
        } while (uVar23 < uVar21);
      }
      ListVector::SetListSize
                (local_120,
                 uVar21 * (long)local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish);
      break;
    case UINT64:
      local_168.count =
           (idx_t)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(((long)((long)local_168.vector_caches.
                                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   .
                                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            local_168.count) >> 3) * 0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count *
                                 (long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)result->data;
      pVVar16 = ListVector::GetEntry(result);
      pdVar4 = pVVar16->data;
      FlatVector::VerifyFlatVector(pVVar16);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar21 = args->count;
      if (uVar21 != 0) {
        local_168.capacity =
             (idx_t)&(pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(&(local_168.data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish)->vector_type +
                      (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish == (pointer)0x0));
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar23 = 0;
        do {
          if (local_168.vector_caches.
              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
              super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)local_168.count) {
            lVar29 = 2;
            pVVar27 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            pVVar26 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              lVar5 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar29 * 8 + -0x10);
              uVar21 = uVar23;
              if (lVar5 != 0) {
                uVar21 = (ulong)*(uint *)(lVar5 + uVar23 * 4);
              }
              if ((*(SelectionVector **)
                    ((long)&(local_168.data.
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_start)->vector_type + lVar29 * 8) ==
                   (SelectionVector *)0x0) ||
                 (((ulong)(&(*(SelectionVector **)
                              ((long)&(local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                              lVar29 * 8))->sel_vector)[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0))
              {
                *(undefined8 *)(pdVar4 + (long)pVVar27 * 8) =
                     *(undefined8 *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar29 * 8 + -8)
                      + uVar21 * 8);
              }
              else {
                if ((pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar14 = apeStack_f0[0];
                  auVar13 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var6 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar13;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar14;
                  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                  }
                  if (apeStack_f0[0] != (element_type *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.capacity);
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar17->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar9 = (byte)pVVar27 & 0x3f;
                puVar1 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_mask + ((ulong)pVVar27 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              pVVar27 = (pointer)&pVVar27->field_0x1;
              lVar29 = lVar29 + 9;
              pVVar26 = pVVar26 + -1;
            } while (pVVar26 != (data_ptr_t)0x0);
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->buffer + uVar23 * 0x10) =
               uVar23 * (long)local_168.data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_finish + 8))->id_ + uVar23 * 0x10) =
               local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
          uVar23 = uVar23 + 1;
          uVar21 = local_128->count;
          local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(&(local_168.data.
                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->vector_type +
                        (long)&(local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)->vector_type);
        } while (uVar23 < uVar21);
      }
      ListVector::SetListSize
                (local_120,
                 uVar21 * (long)local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish);
      break;
    case INT64:
      local_168.count =
           (idx_t)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(((long)((long)local_168.vector_caches.
                                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   .
                                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            local_168.count) >> 3) * 0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count *
                                 (long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)result->data;
      pVVar16 = ListVector::GetEntry(result);
      pdVar4 = pVVar16->data;
      FlatVector::VerifyFlatVector(pVVar16);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar21 = args->count;
      if (uVar21 != 0) {
        local_168.capacity =
             (idx_t)&(pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(&(local_168.data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish)->vector_type +
                      (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish == (pointer)0x0));
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar23 = 0;
        do {
          if (local_168.vector_caches.
              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
              super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)local_168.count) {
            lVar29 = 2;
            pVVar27 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            pVVar26 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              lVar5 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar29 * 8 + -0x10);
              uVar21 = uVar23;
              if (lVar5 != 0) {
                uVar21 = (ulong)*(uint *)(lVar5 + uVar23 * 4);
              }
              if ((*(SelectionVector **)
                    ((long)&(local_168.data.
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_start)->vector_type + lVar29 * 8) ==
                   (SelectionVector *)0x0) ||
                 (((ulong)(&(*(SelectionVector **)
                              ((long)&(local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                              lVar29 * 8))->sel_vector)[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0))
              {
                *(undefined8 *)(pdVar4 + (long)pVVar27 * 8) =
                     *(undefined8 *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar29 * 8 + -8)
                      + uVar21 * 8);
              }
              else {
                if ((pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar14 = apeStack_f0[0];
                  auVar13 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var6 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar13;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar14;
                  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                  }
                  if (apeStack_f0[0] != (element_type *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.capacity);
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar17->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar9 = (byte)pVVar27 & 0x3f;
                puVar1 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_mask + ((ulong)pVVar27 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              pVVar27 = (pointer)&pVVar27->field_0x1;
              lVar29 = lVar29 + 9;
              pVVar26 = pVVar26 + -1;
            } while (pVVar26 != (data_ptr_t)0x0);
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->buffer + uVar23 * 0x10) =
               uVar23 * (long)local_168.data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_finish + 8))->id_ + uVar23 * 0x10) =
               local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
          uVar23 = uVar23 + 1;
          uVar21 = local_128->count;
          local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(&(local_168.data.
                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->vector_type +
                        (long)&(local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)->vector_type);
        } while (uVar23 < uVar21);
      }
      ListVector::SetListSize
                (local_120,
                 uVar21 * (long)local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish);
      break;
    default:
switchD_01a98c8b_caseD_a:
      target_type = ListType::GetChildType(&result->type);
      if (args->count == 0) {
        return;
      }
      local_168.capacity = (idx_t)result->data;
      iVar31 = 0;
      do {
        iVar20 = ListVector::GetListSize(result);
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(iVar31 * 0x10);
        *(idx_t *)(local_168.capacity +
                  (long)local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                        .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage) = iVar20;
        if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar21 = 0;
        }
        else {
          iVar20 = 0;
          do {
            DataChunk::GetValue(&local_88,local_128,iVar20,iVar31);
            Value::DefaultCastAs((Value *)local_f8,&local_88,target_type,false);
            Value::~Value(&local_88);
            ListVector::PushBack(result,(Value *)local_f8);
            Value::~Value((Value *)local_f8);
            iVar20 = iVar20 + 1;
            uVar21 = ((long)(local_128->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_128->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
          } while (iVar20 < uVar21);
        }
        *(ulong *)(local_168.capacity +
                  (long)&(local_168.data.
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage)->type) = uVar21;
        iVar31 = iVar31 + 1;
        args = local_128;
      } while (iVar31 < local_128->count);
      return;
    case FLOAT:
      local_168.count =
           (idx_t)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(((long)((long)local_168.vector_caches.
                                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   .
                                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            local_168.count) >> 3) * 0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count *
                                 (long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)result->data;
      pVVar16 = ListVector::GetEntry(result);
      pdVar4 = pVVar16->data;
      FlatVector::VerifyFlatVector(pVVar16);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar21 = args->count;
      if (uVar21 != 0) {
        local_168.capacity =
             (idx_t)&(pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(&(local_168.data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish)->vector_type +
                      (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish == (pointer)0x0));
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar23 = 0;
        do {
          if (local_168.vector_caches.
              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
              super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)local_168.count) {
            lVar29 = 4;
            pVVar27 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            pVVar26 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              lVar5 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar29 * 4 + -0x10);
              uVar21 = uVar23;
              if (lVar5 != 0) {
                uVar21 = (ulong)*(uint *)(lVar5 + uVar23 * 4);
              }
              lVar5 = *(long *)((long)&(local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                               lVar29 * 4);
              if ((lVar5 == 0) ||
                 ((*(ulong *)(lVar5 + (uVar21 >> 6) * 8) >> (uVar21 & 0x3f) & 1) != 0)) {
                *(undefined4 *)(pdVar4 + (long)pVVar27 * 4) =
                     *(undefined4 *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar29 * 4 + -8)
                      + uVar21 * 4);
              }
              else {
                if ((pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar14 = apeStack_f0[0];
                  auVar13 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var6 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar13;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar14;
                  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                  }
                  if (apeStack_f0[0] != (element_type *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.capacity);
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar17->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar9 = (byte)pVVar27 & 0x3f;
                puVar1 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_mask + ((ulong)pVVar27 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              pVVar27 = (pointer)&pVVar27->field_0x1;
              lVar29 = lVar29 + 0x12;
              pVVar26 = pVVar26 + -1;
            } while (pVVar26 != (data_ptr_t)0x0);
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->buffer + uVar23 * 0x10) =
               uVar23 * (long)local_168.data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_finish + 8))->id_ + uVar23 * 0x10) =
               local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
          uVar23 = uVar23 + 1;
          uVar21 = local_128->count;
          local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(&(local_168.data.
                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->vector_type +
                        (long)&(local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)->vector_type);
        } while (uVar23 < uVar21);
      }
      ListVector::SetListSize
                (local_120,
                 uVar21 * (long)local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish);
      break;
    case DOUBLE:
      local_168.count =
           (idx_t)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(((long)((long)local_168.vector_caches.
                                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   .
                                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            local_168.count) >> 3) * 0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count *
                                 (long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)result->data;
      pVVar16 = ListVector::GetEntry(result);
      pdVar4 = pVVar16->data;
      FlatVector::VerifyFlatVector(pVVar16);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar21 = args->count;
      if (uVar21 != 0) {
        local_168.capacity =
             (idx_t)&(pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(&(local_168.data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish)->vector_type +
                      (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish == (pointer)0x0));
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar23 = 0;
        do {
          if (local_168.vector_caches.
              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
              super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)local_168.count) {
            lVar29 = 2;
            pVVar27 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            pVVar26 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              lVar5 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar29 * 8 + -0x10);
              uVar21 = uVar23;
              if (lVar5 != 0) {
                uVar21 = (ulong)*(uint *)(lVar5 + uVar23 * 4);
              }
              if ((*(SelectionVector **)
                    ((long)&(local_168.data.
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_start)->vector_type + lVar29 * 8) ==
                   (SelectionVector *)0x0) ||
                 (((ulong)(&(*(SelectionVector **)
                              ((long)&(local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                              lVar29 * 8))->sel_vector)[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0))
              {
                *(undefined8 *)(pdVar4 + (long)pVVar27 * 8) =
                     *(undefined8 *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar29 * 8 + -8)
                      + uVar21 * 8);
              }
              else {
                if ((pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar14 = apeStack_f0[0];
                  auVar13 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var6 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar13;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar14;
                  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                  }
                  if (apeStack_f0[0] != (element_type *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.capacity);
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar17->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar9 = (byte)pVVar27 & 0x3f;
                puVar1 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_mask + ((ulong)pVVar27 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              pVVar27 = (pointer)&pVVar27->field_0x1;
              lVar29 = lVar29 + 9;
              pVVar26 = pVVar26 + -1;
            } while (pVVar26 != (data_ptr_t)0x0);
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->buffer + uVar23 * 0x10) =
               uVar23 * (long)local_168.data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_finish + 8))->id_ + uVar23 * 0x10) =
               local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
          uVar23 = uVar23 + 1;
          uVar21 = local_128->count;
          local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(&(local_168.data.
                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->vector_type +
                        (long)&(local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)->vector_type);
        } while (uVar23 < uVar21);
      }
      ListVector::SetListSize
                (local_120,
                 uVar21 * (long)local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish);
      break;
    case INTERVAL:
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_168.count =
           ((long)local_168.vector_caches.
                  super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                  super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_168.vector_caches.
                  super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                  super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage >> 3) * 0x4ec4ec4ec4ec4ec5;
      ListVector::Reserve(result,args->count * local_168.count);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)result->data;
      pVVar16 = ListVector::GetEntry(result);
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pVVar16->data;
      FlatVector::VerifyFlatVector(pVVar16);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar21 = args->count;
      if (uVar21 != 0) {
        local_168.capacity =
             (idx_t)&(pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_118 = (pointer)((VectorType *)local_168.count +
                             ((pointer)local_168.count == (pointer)0x0));
        local_110 = (pointer)(local_168.count << 4);
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        uVar23 = 0;
        do {
          if (local_168.vector_caches.
              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
              super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_168.vector_caches.
              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
              super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            lVar29 = 0x10;
            pVVar27 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            pVVar25 = local_118;
            pVVar28 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            do {
              lVar5 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar29 + -0x10);
              uVar21 = uVar23;
              if (lVar5 != 0) {
                uVar21 = (ulong)*(uint *)(lVar5 + uVar23 * 4);
              }
              lVar5 = *(long *)((long)&(local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                               lVar29);
              if ((lVar5 == 0) ||
                 ((*(ulong *)(lVar5 + (uVar21 >> 6) * 8) >> (uVar21 & 0x3f) & 1) != 0)) {
                puVar2 = (undefined8 *)
                         (*(long *)((long)local_168.data.
                                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                          .
                                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar29 + -8) +
                         uVar21 * 0x10);
                uVar10 = puVar2[1];
                *(undefined8 *)pVVar27 = *puVar2;
                (pVVar27->type).id_ = (char)uVar10;
                (pVVar27->type).physical_type_ = (char)((ulong)uVar10 >> 8);
                *(int6 *)&(pVVar27->type).field_0x2 = (int6)((ulong)uVar10 >> 0x10);
              }
              else {
                if ((pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar14 = apeStack_f0[0];
                  auVar13 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var6 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar13;
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar14;
                  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                  }
                  if (apeStack_f0[0] != (element_type *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.capacity);
                  (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar17->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar9 = (byte)pVVar28 & 0x3f;
                puVar1 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_mask + ((ulong)pVVar28 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              pVVar28 = (pointer)&pVVar28->field_0x1;
              pVVar27 = (pointer)&(pVVar27->type).type_info_;
              lVar29 = lVar29 + 0x48;
              pVVar25 = (pointer)((long)pVVar25 + -1);
            } while (pVVar25 != (pointer)0x0);
          }
          *(ulong *)((long)local_168.vector_caches.
                           super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                           super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar23 * 0x10) =
               uVar23 * local_168.count;
          *(idx_t *)((long)local_168.vector_caches.
                           super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                           super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar23 * 0x10 + 8) =
               local_168.count;
          uVar23 = uVar23 + 1;
          uVar21 = local_128->count;
          local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((VectorType *)local_168.count +
                        (long)&(local_168.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish)->vector_type);
          local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)&(((original *)
                                 &(local_168.data.
                                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->vector_type)
                                ->
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + (long)local_110);
        } while (uVar23 < uVar21);
      }
      ListVector::SetListSize(local_120,uVar21 * local_168.count);
      break;
    case LIST:
      pVVar27 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar25 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(((long)pVVar25 - (long)pVVar27 >> 3) * 0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count *
                                 (long)local_168.vector_caches.
                                       super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                       .
                                       super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
      local_88.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_88.type_._0_8_ = (pointer)0x0;
      local_88.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_108._8_8_ = (pointer)0x0;
      local_118 = pVVar25;
      local_110 = pVVar27;
      if (pVVar25 != pVVar27) {
        bVar32 = local_168.vector_caches.
                 super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                 super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                 _M_impl.super__Vector_impl_data._M_start == (pointer)0x0;
        pbVar11 = &(local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_start)->buffer;
        sVar22 = 0;
        do {
          if (local_88.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)
              local_88.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_88,
                       (iterator)
                       local_88.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (unsigned_long *)(local_108 + 8));
          }
          else {
            (local_88.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_ExtraTypeInfo = local_108._8_8_;
            local_88.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 ((long)local_88.type_.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 + 8);
          }
          pvVar15 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar22);
          iVar31 = ListVector::GetListSize(pvVar15);
          local_108._8_8_ = (VectorType *)local_108._8_8_ + iVar31;
          sVar22 = sVar22 + 1;
        } while ((long)&(pbVar11->internal).
                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 + (ulong)bVar32 != sVar22);
      }
      pVVar16 = local_120;
      pVVar18 = ListVector::GetEntry(local_120);
      ListVector::Reserve(pVVar18,local_108._8_8_);
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish = pVVar18;
      local_168.capacity = (idx_t)ListVector::GetEntry(pVVar18);
      if (local_118 != local_110) {
        bVar32 = local_168.vector_caches.
                 super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                 super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                 _M_impl.super__Vector_impl_data._M_start == (pointer)0x0;
        pbVar11 = &(local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_start)->buffer;
        sVar22 = 0;
        do {
          pvVar15 = vector<duckdb::Vector,_true>::operator[](&local_128->data,sVar22);
          Vector::Vector((Vector *)local_f8,pvVar15);
          iVar31 = ListVector::GetListSize((Vector *)local_f8);
          if (iVar31 != 0) {
            pVVar18 = ListVector::GetEntry((Vector *)local_f8);
            pvVar19 = vector<unsigned_long,_true>::operator[]
                                ((vector<unsigned_long,_true> *)&local_88,sVar22);
            VectorOperations::Copy(pVVar18,(Vector *)local_168.capacity,iVar31,0,*pvVar19);
          }
          if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
          }
          if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
          }
          if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
          }
          LogicalType::~LogicalType((LogicalType *)apeStack_f0);
          sVar22 = sVar22 + 1;
        } while ((long)&(pbVar11->internal).
                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 + (ulong)bVar32 != sVar22);
      }
      local_38 = pVVar16->data;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_finish)->data;
      FlatVector::VerifyFlatVector
                (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      pDVar12 = local_128;
      DataChunk::ToUnifiedFormat((DataChunk *)local_108);
      puVar24 = (undefined1 *)pDVar12->count;
      if (puVar24 != (undefined1 *)0x0) {
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)&((local_168.data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish)->validity).
                       super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.capacity =
             (long)&((local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_start)->buffer).internal.
                    super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             (ulong)(local_168.vector_caches.
                     super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                     super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                     _M_impl.super__Vector_impl_data._M_start == (pointer)0x0);
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((long)local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 8);
        local_40 = (long)local_168.vector_caches.
                         super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                         super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                         ._M_impl.super__Vector_impl_data._M_start << 4;
        local_168.count = 0;
        pVVar27 = (pointer)0x0;
        do {
          if (local_118 != local_110) {
            lVar29 = 0x10;
            __n = 0;
            p_Var30 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = pVVar27;
            do {
              pVVar25 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                        .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                        .super__Vector_impl_data._M_finish;
              lVar5 = **(long **)(local_108._0_8_ + lVar29 + -0x10);
              pVVar28 = pVVar27;
              if (lVar5 != 0) {
                pVVar28 = (pointer)(ulong)*(uint *)(lVar5 + (long)pVVar27 * 4);
              }
              lVar5 = *(long *)(local_108._0_8_ + lVar29 + -8);
              lVar8 = *(long *)((long)(SelectionVector **)local_108._0_8_ + lVar29);
              if ((lVar8 == 0) ||
                 ((*(ulong *)(lVar8 + ((ulong)pVVar28 >> 6) * 8) >> ((ulong)pVVar28 & 0x3f) & 1) !=
                  0)) {
                peVar7 = *(element_type **)(lVar5 + 8 + (long)pVVar28 * 0x10);
                pvVar19 = vector<unsigned_long,_true>::operator[]
                                    ((vector<unsigned_long,_true> *)&local_88,__n);
                ((__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)(p_Var30 + -1))->
                _M_ptr = (element_type *)(*(long *)(lVar5 + (long)pVVar28 * 0x10) + *pvVar19);
                (((buffer_ptr<VectorBuffer> *)&p_Var30->_M_pi)->internal).
                super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7
                ;
                pVVar27 = local_168.data.
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
              }
              else {
                if (((local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_finish)->validity).
                    super_TemplatedValidityMask<unsigned_long>.validity_mask == (unsigned_long *)0x0
                   ) {
                  local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)((local_168.data.
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->validity).
                                super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_168);
                  peVar14 = apeStack_f0[0];
                  auVar13 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var6 = (pVVar25->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar25->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar13;
                  (pVVar25->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar14;
                  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                  }
                  if (apeStack_f0[0] != (element_type *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.vector_caches.
                                          super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                          .
                                          super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  ((local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish)->validity).
                  super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar17->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                  pVVar27 = local_168.data.
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
                }
                bVar9 = (byte)(__n + local_168.count) & 0x3f;
                puVar1 = ((local_168.data.
                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->validity).
                         super_TemplatedValidityMask<unsigned_long>.validity_mask +
                         (__n + local_168.count >> 6);
                *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              __n = __n + 1;
              p_Var30 = p_Var30 + 2;
              lVar29 = lVar29 + 0x48;
            } while (local_168.capacity != __n);
          }
          *(long *)(local_38 + (long)pVVar27 * 0x10) =
               (long)pVVar27 *
               (long)local_168.vector_caches.
                     super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                     super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          *(pointer *)(local_38 + (long)pVVar27 * 0x10 + 8) =
               local_168.vector_caches.
               super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
               super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl
               .super__Vector_impl_data._M_start;
          pVVar27 = (pointer)&pVVar27->field_0x1;
          puVar24 = (undefined1 *)local_128->count;
          local_168.count =
               (long)&((local_168.vector_caches.
                        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                        ._M_impl.super__Vector_impl_data._M_start)->buffer).internal.
                      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               local_168.count;
          local_168.vector_caches.
          super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
          super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((long)&((local_168.vector_caches.
                                  super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                  .
                                  super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->buffer).internal.
                                super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + local_40);
        } while (pVVar27 < puVar24);
      }
      ListVector::SetListSize
                (local_120,
                 (long)puVar24 *
                 (long)local_168.vector_caches.
                       super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                       super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      ListVector::SetListSize
                (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_108._8_8_);
      if ((pointer)local_108._0_8_ != (pointer)0x0) {
        ::std::default_delete<duckdb::UnifiedVectorFormat[]>::operator()
                  ((default_delete<duckdb::UnifiedVectorFormat[]> *)local_108,
                   (UnifiedVectorFormat *)local_108._0_8_);
      }
      if ((pointer)local_88.type_._0_8_ == (pointer)0x0) {
        return;
      }
      operator_delete((void *)local_88.type_._0_8_);
      return;
    }
  }
  else if (PVar3 == VARCHAR) {
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_168.count =
         ((long)local_168.vector_caches.
                super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_168.vector_caches.
                super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage >> 3) * 0x4ec4ec4ec4ec4ec5;
    ListVector::Reserve(result,args->count * local_168.count);
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)result->data;
    pVVar16 = ListVector::GetEntry(result);
    local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pVVar16->data;
    FlatVector::VerifyFlatVector(pVVar16);
    DataChunk::ToUnifiedFormat(&local_168);
    uVar21 = args->count;
    if (uVar21 != 0) {
      local_168.capacity =
           (idx_t)&(pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      local_118 = (pointer)((VectorType *)local_168.count +
                           ((pointer)local_168.count == (pointer)0x0));
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)&(local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage)->type;
      local_110 = (pointer)(local_168.count << 4);
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar23 = 0;
      do {
        if (local_168.vector_caches.
            super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
            super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_168.vector_caches.
            super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
            super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          lVar29 = 0x10;
          pVVar27 = local_118;
          pVVar25 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          pVVar28 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          do {
            lVar5 = **(long **)((long)local_168.data.
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar29 + -0x10);
            uVar21 = uVar23;
            if (lVar5 != 0) {
              uVar21 = (ulong)*(uint *)(lVar5 + uVar23 * 4);
            }
            lVar5 = *(long *)((long)local_168.data.
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar29 + -8);
            lVar8 = *(long *)((long)&(local_168.data.
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                             lVar29);
            if ((lVar8 == 0) ||
               ((*(ulong *)(lVar8 + (uVar21 >> 6) * 8) >> (uVar21 & 0x3f) & 1) != 0)) {
              sVar33.value.pointer.ptr = (char *)lVar5;
              sVar33.value._0_8_ = *(undefined8 *)(lVar5 + 8 + uVar21 * 0x10);
              sVar33 = StringVector::AddStringOrBlob
                                 ((StringVector *)pVVar16,*(Vector **)(lVar5 + uVar21 * 0x10),sVar33
                                 );
              pVVar28[-1].auxiliary.internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                   = sVar33.value._0_8_;
              *(long *)pVVar28 = sVar33.value._8_8_;
            }
            else {
              if ((pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_88.type_._0_8_ =
                     (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_f8,(unsigned_long *)&local_88);
                peVar14 = apeStack_f0[0];
                auVar13 = local_f8;
                local_f8 = (undefined1  [8])0x0;
                apeStack_f0[0] = (element_type *)0x0;
                p_Var6 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar13;
                (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar14;
                if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                }
                if (apeStack_f0[0] != (element_type *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                }
                pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)local_168.capacity);
                (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar17->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar9 = (byte)pVVar25 & 0x3f;
              puVar1 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                       + ((ulong)pVVar25 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
            }
            pVVar25 = (pointer)&pVVar25->field_0x1;
            pVVar28 = (pointer)&(pVVar28->type).type_info_;
            lVar29 = lVar29 + 0x48;
            pVVar27 = (pointer)((long)pVVar27 + -1);
          } while (pVVar27 != (pointer)0x0);
        }
        *(ulong *)((long)local_168.vector_caches.
                         super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                         super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar23 * 0x10) =
             uVar23 * local_168.count;
        *(idx_t *)((long)local_168.vector_caches.
                         super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                         super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar23 * 0x10 + 8) =
             local_168.count;
        uVar23 = uVar23 + 1;
        uVar21 = local_128->count;
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((VectorType *)local_168.count +
                      (long)&(local_168.data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish)->vector_type);
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(&(local_168.data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage)->vector_type + (long)local_110)
        ;
      } while (uVar23 < uVar21);
    }
    ListVector::SetListSize(local_120,uVar21 * local_168.count);
  }
  else if (PVar3 == UINT128) {
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_168.count =
         ((long)local_168.vector_caches.
                super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_168.vector_caches.
                super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage >> 3) * 0x4ec4ec4ec4ec4ec5;
    ListVector::Reserve(result,args->count * local_168.count);
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)result->data;
    pVVar16 = ListVector::GetEntry(result);
    local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pVVar16->data;
    FlatVector::VerifyFlatVector(pVVar16);
    DataChunk::ToUnifiedFormat(&local_168);
    uVar21 = args->count;
    if (uVar21 != 0) {
      local_168.capacity =
           (idx_t)&(pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      local_118 = (pointer)((VectorType *)local_168.count +
                           ((pointer)local_168.count == (pointer)0x0));
      local_110 = (pointer)(local_168.count << 4);
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar23 = 0;
      do {
        if (local_168.vector_caches.
            super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
            super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_168.vector_caches.
            super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
            super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          lVar29 = 0x10;
          pVVar27 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          pVVar25 = local_118;
          pVVar28 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          do {
            lVar5 = **(long **)((long)local_168.data.
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar29 + -0x10);
            uVar21 = uVar23;
            if (lVar5 != 0) {
              uVar21 = (ulong)*(uint *)(lVar5 + uVar23 * 4);
            }
            lVar5 = *(long *)((long)&(local_168.data.
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                             lVar29);
            if ((lVar5 == 0) ||
               ((*(ulong *)(lVar5 + (uVar21 >> 6) * 8) >> (uVar21 & 0x3f) & 1) != 0)) {
              puVar2 = (undefined8 *)
                       (*(long *)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar29 + -8) +
                       uVar21 * 0x10);
              uVar10 = puVar2[1];
              *(undefined8 *)pVVar27 = *puVar2;
              (pVVar27->type).id_ = (char)uVar10;
              (pVVar27->type).physical_type_ = (char)((ulong)uVar10 >> 8);
              *(int6 *)&(pVVar27->type).field_0x2 = (int6)((ulong)uVar10 >> 0x10);
            }
            else {
              if ((pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_88.type_._0_8_ =
                     (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_f8,(unsigned_long *)&local_88);
                peVar14 = apeStack_f0[0];
                auVar13 = local_f8;
                local_f8 = (undefined1  [8])0x0;
                apeStack_f0[0] = (element_type *)0x0;
                p_Var6 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar13;
                (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar14;
                if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                }
                if (apeStack_f0[0] != (element_type *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                }
                pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)local_168.capacity);
                (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar17->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar9 = (byte)pVVar28 & 0x3f;
              puVar1 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                       + ((ulong)pVVar28 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
            }
            pVVar28 = (pointer)&pVVar28->field_0x1;
            pVVar27 = (pointer)&(pVVar27->type).type_info_;
            lVar29 = lVar29 + 0x48;
            pVVar25 = (pointer)((long)pVVar25 + -1);
          } while (pVVar25 != (pointer)0x0);
        }
        *(ulong *)((long)local_168.vector_caches.
                         super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                         super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar23 * 0x10) =
             uVar23 * local_168.count;
        *(idx_t *)((long)local_168.vector_caches.
                         super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                         super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar23 * 0x10 + 8) =
             local_168.count;
        uVar23 = uVar23 + 1;
        uVar21 = local_128->count;
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((VectorType *)local_168.count +
                      (long)&(local_168.data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish)->vector_type);
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(&(local_168.data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage)->vector_type + (long)local_110)
        ;
      } while (uVar23 < uVar21);
    }
    ListVector::SetListSize(local_120,uVar21 * local_168.count);
  }
  else {
    if (PVar3 != INT128) goto switchD_01a98c8b_caseD_a;
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_168.count =
         ((long)local_168.vector_caches.
                super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_168.vector_caches.
                super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage >> 3) * 0x4ec4ec4ec4ec4ec5;
    ListVector::Reserve(result,args->count * local_168.count);
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)result->data;
    pVVar16 = ListVector::GetEntry(result);
    local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pVVar16->data;
    FlatVector::VerifyFlatVector(pVVar16);
    DataChunk::ToUnifiedFormat(&local_168);
    uVar21 = args->count;
    if (uVar21 != 0) {
      local_168.capacity =
           (idx_t)&(pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      local_118 = (pointer)((VectorType *)local_168.count +
                           ((pointer)local_168.count == (pointer)0x0));
      local_110 = (pointer)(local_168.count << 4);
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar23 = 0;
      do {
        if (local_168.vector_caches.
            super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
            super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_168.vector_caches.
            super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
            super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          lVar29 = 0x10;
          pVVar27 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          pVVar25 = local_118;
          pVVar28 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          do {
            lVar5 = **(long **)((long)local_168.data.
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar29 + -0x10);
            uVar21 = uVar23;
            if (lVar5 != 0) {
              uVar21 = (ulong)*(uint *)(lVar5 + uVar23 * 4);
            }
            lVar5 = *(long *)((long)&(local_168.data.
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                             lVar29);
            if ((lVar5 == 0) ||
               ((*(ulong *)(lVar5 + (uVar21 >> 6) * 8) >> (uVar21 & 0x3f) & 1) != 0)) {
              puVar2 = (undefined8 *)
                       (*(long *)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar29 + -8) +
                       uVar21 * 0x10);
              uVar10 = puVar2[1];
              *(undefined8 *)pVVar27 = *puVar2;
              (pVVar27->type).id_ = (char)uVar10;
              (pVVar27->type).physical_type_ = (char)((ulong)uVar10 >> 8);
              *(int6 *)&(pVVar27->type).field_0x2 = (int6)((ulong)uVar10 >> 0x10);
            }
            else {
              if ((pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_88.type_._0_8_ =
                     (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_f8,(unsigned_long *)&local_88);
                peVar14 = apeStack_f0[0];
                auVar13 = local_f8;
                local_f8 = (undefined1  [8])0x0;
                apeStack_f0[0] = (element_type *)0x0;
                p_Var6 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar13;
                (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar14;
                if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                }
                if (apeStack_f0[0] != (element_type *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                }
                pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)local_168.capacity);
                (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar17->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar9 = (byte)pVVar28 & 0x3f;
              puVar1 = (pVVar16->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                       + ((ulong)pVVar28 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
            }
            pVVar28 = (pointer)&pVVar28->field_0x1;
            pVVar27 = (pointer)&(pVVar27->type).type_info_;
            lVar29 = lVar29 + 0x48;
            pVVar25 = (pointer)((long)pVVar25 + -1);
          } while (pVVar25 != (pointer)0x0);
        }
        *(ulong *)((long)local_168.vector_caches.
                         super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                         super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar23 * 0x10) =
             uVar23 * local_168.count;
        *(idx_t *)((long)local_168.vector_caches.
                         super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                         super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar23 * 0x10 + 8) =
             local_168.count;
        uVar23 = uVar23 + 1;
        uVar21 = local_128->count;
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((VectorType *)local_168.count +
                      (long)&(local_168.data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish)->vector_type);
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)&(((original *)
                               &(local_168.data.
                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->vector_type)->
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>)
                              ._M_ptr + (long)local_110);
      } while (uVar23 < uVar21);
    }
    ListVector::SetListSize(local_120,uVar21 * local_168.count);
  }
  if (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    ::std::default_delete<duckdb::UnifiedVectorFormat[]>::operator()
              ((default_delete<duckdb::UnifiedVectorFormat[]> *)&local_168,
               (UnifiedVectorFormat *)
               local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void ListValueFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	if (args.ColumnCount() == 0) {
		// no columns - early out - result is a constant empty list
		auto result_data = FlatVector::GetData<list_entry_t>(result);
		result_data[0].length = 0;
		result_data[0].offset = 0;
		return;
	}
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::FLAT_VECTOR);
		}
	}
	auto &result_type = ListVector::GetEntry(result).GetType();
	switch (result_type.InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedListValueFunction<int8_t>(args, result);
		break;
	case PhysicalType::INT16:
		TemplatedListValueFunction<int16_t>(args, result);
		break;
	case PhysicalType::INT32:
		TemplatedListValueFunction<int32_t>(args, result);
		break;
	case PhysicalType::INT64:
		TemplatedListValueFunction<int64_t>(args, result);
		break;
	case PhysicalType::UINT8:
		TemplatedListValueFunction<uint8_t>(args, result);
		break;
	case PhysicalType::UINT16:
		TemplatedListValueFunction<uint16_t>(args, result);
		break;
	case PhysicalType::UINT32:
		TemplatedListValueFunction<uint32_t>(args, result);
		break;
	case PhysicalType::UINT64:
		TemplatedListValueFunction<uint64_t>(args, result);
		break;
	case PhysicalType::INT128:
		TemplatedListValueFunction<hugeint_t>(args, result);
		break;
	case PhysicalType::UINT128:
		TemplatedListValueFunction<uhugeint_t>(args, result);
		break;
	case PhysicalType::FLOAT:
		TemplatedListValueFunction<float>(args, result);
		break;
	case PhysicalType::DOUBLE:
		TemplatedListValueFunction<double>(args, result);
		break;
	case PhysicalType::INTERVAL:
		TemplatedListValueFunction<interval_t>(args, result);
		break;
	case PhysicalType::VARCHAR:
		TemplatedListValueFunction<string_t, ListValueStringAssign>(args, result);
		break;
	case PhysicalType::LIST:
		ListValueListFunction(args, result);
		break;
	default: {
		TemplatedListValueFunctionFallback(args, result);
		break;
	}
	}
}